

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::text_output_indent
               (xml_buffered_writer *writer,char_t *indent,size_t indent_length,uint depth)

{
  ulong uVar1;
  char_t cVar2;
  char_t cVar3;
  char_t cVar4;
  size_t sVar5;
  
  switch(indent_length) {
  case 1:
    if (depth != 0) {
      sVar5 = writer->bufsize;
      do {
        cVar2 = *indent;
        if (0x7ff < sVar5) {
          xml_buffered_writer::flush(writer,writer->buffer,sVar5);
          sVar5 = 0;
        }
        writer->buffer[sVar5] = cVar2;
        sVar5 = sVar5 + 1;
        depth = depth - 1;
        writer->bufsize = sVar5;
      } while (depth != 0);
    }
    break;
  case 2:
    if (depth != 0) {
      sVar5 = writer->bufsize;
      do {
        cVar2 = *indent;
        cVar3 = indent[1];
        if (0x7fe < sVar5) {
          xml_buffered_writer::flush(writer,writer->buffer,sVar5);
          sVar5 = 0;
        }
        writer->buffer[sVar5] = cVar2;
        writer->buffer[sVar5 + 1] = cVar3;
        sVar5 = sVar5 + 2;
        depth = depth - 1;
        writer->bufsize = sVar5;
      } while (depth != 0);
    }
    break;
  case 3:
    if (depth != 0) {
      sVar5 = writer->bufsize;
      do {
        cVar2 = *indent;
        cVar3 = indent[1];
        cVar4 = indent[2];
        if (0x7fd < sVar5) {
          xml_buffered_writer::flush(writer,writer->buffer,sVar5);
          sVar5 = 0;
        }
        writer->buffer[sVar5] = cVar2;
        writer->buffer[sVar5 + 1] = cVar3;
        writer->buffer[sVar5 + 2] = cVar4;
        sVar5 = sVar5 + 3;
        depth = depth - 1;
        writer->bufsize = sVar5;
      } while (depth != 0);
    }
    break;
  case 4:
    if (depth != 0) {
      do {
        xml_buffered_writer::write(writer,(uint)*indent,(void *)(ulong)indent[1],(ulong)indent[2]);
        depth = depth - 1;
      } while (depth != 0);
    }
    break;
  default:
    if (depth != 0) {
      do {
        uVar1 = writer->bufsize + indent_length;
        if (uVar1 < 0x801) {
          memcpy(writer->buffer + writer->bufsize,indent,indent_length);
          writer->bufsize = uVar1;
        }
        else {
          xml_buffered_writer::write_direct(writer,indent,indent_length);
        }
        depth = depth - 1;
      } while (depth != 0);
    }
  }
  return;
}

Assistant:

PUGI__FN void text_output_indent(xml_buffered_writer& writer, const char_t* indent, size_t indent_length, unsigned int depth)
	{
		switch (indent_length)
		{
		case 1:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0]);
			break;
		}

		case 2:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1]);
			break;
		}

		case 3:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1], indent[2]);
			break;
		}

		case 4:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1], indent[2], indent[3]);
			break;
		}

		default:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write_buffer(indent, indent_length);
		}
		}
	}